

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcfread.c
# Opt level: O1

FT_Error pcf_load_font(FT_Stream stream,PCF_Face face,FT_Long face_index)

{
  PCF_Table pPVar1;
  PCF_Table pPVar2;
  FT_Byte FVar3;
  FT_Memory pFVar4;
  undefined1 auVar5 [16];
  FT_ULong FVar6;
  ushort uVar7;
  short sVar8;
  short sVar9;
  PCF_Table pPVar10;
  ulong *puVar11;
  FT_Memory pFVar12;
  FT_ULong FVar13;
  FT_Memory pFVar14;
  ulong *puVar15;
  ulong uVar16;
  PCF_Property pPVar17;
  FT_String *pFVar18;
  PCF_Metric metric;
  FT_Bitmap_Size *pFVar19;
  FT_Byte *buffer;
  FT_Pointer pvVar20;
  FT_Long FVar21;
  PCF_Property pPVar22;
  char *pcVar23;
  int iVar24;
  ulong uVar25;
  short sVar26;
  uint uVar27;
  FT_Frame_Field *fields;
  int iVar28;
  long lVar29;
  FT_ULong FVar30;
  bool bVar31;
  bool bVar32;
  FT_Error error_2;
  FT_Error error;
  FT_Error error_1;
  FT_ULong format;
  uint local_98;
  uint local_94;
  undefined8 local_90;
  ulong *local_88;
  FT_Memory local_80;
  PCF_Property local_78;
  FT_Memory local_70;
  FT_Memory local_68;
  FT_Memory local_60;
  ulong *local_58;
  FT_ULong FStack_50;
  FT_ULong local_48;
  FT_ULong FStack_40;
  
  local_68 = (face->root).memory;
  local_90._0_4_ = FT_Stream_Seek(stream,0);
  local_94 = 1;
  if ((uint)local_90 == 0) {
    local_90._0_4_ = FT_Stream_ReadFields(stream,pcf_toc_header,&face->toc);
    if (((((uint)local_90 == 0) && (local_94 = 3, (face->toc).version == 0x70636601)) &&
        (uVar16 = (face->toc).count, uVar16 != 0)) && (uVar25 = stream->size, 0xf < uVar25)) {
      if (9 < uVar16 || uVar25 >> 4 < uVar16) {
        uVar16 = 9;
        if (uVar25 < 0x90) {
          uVar16 = uVar25 >> 4;
        }
        (face->toc).count = uVar16;
      }
      pPVar10 = (PCF_Table)
                ft_mem_realloc(local_68,0x20,0,(face->toc).count,(void *)0x0,(FT_Error *)&local_90);
      (face->toc).tables = pPVar10;
      local_94 = (uint)local_90;
      if ((uint)local_90 == 0) {
        if ((face->toc).count != 0) {
          local_94 = 1;
          uVar27 = (uint)local_90;
          do {
            local_90._0_4_ = uVar27;
            local_90._0_4_ = FT_Stream_ReadFields(stream,pcf_table_header,pPVar10);
            if ((uint)local_90 != 0) goto LAB_00147426;
            pPVar10 = pPVar10 + 1;
            uVar16 = (ulong)local_94;
            local_94 = local_94 + 1;
            uVar27 = 0;
          } while (uVar16 < (face->toc).count);
        }
        if ((face->toc).count != 1) {
          pPVar10 = (face->toc).tables;
          uVar16 = 0;
          do {
            uVar27 = 1;
            bVar32 = false;
            do {
              uVar25 = (ulong)(uVar27 - 1);
              if ((face->toc).count + ~uVar16 <= uVar25) {
                iVar28 = (uint)!bVar32 << 3;
                break;
              }
              pPVar1 = pPVar10 + uVar25;
              pPVar2 = pPVar10 + uVar27;
              if (pPVar10[uVar27].offset < pPVar10[uVar25].offset) {
                local_58 = (ulong *)pPVar1->type;
                FStack_50 = pPVar1->format;
                local_48 = pPVar1->size;
                FStack_40 = pPVar1->offset;
                FVar13 = pPVar2->type;
                FVar30 = pPVar2->format;
                FVar6 = pPVar2->offset;
                pPVar1->size = pPVar2->size;
                pPVar1->offset = FVar6;
                pPVar1->type = FVar13;
                pPVar1->format = FVar30;
                pPVar2->size = local_48;
                pPVar2->offset = FStack_40;
                pPVar2->type = (FT_ULong)local_58;
                pPVar2->format = FStack_50;
                bVar32 = true;
              }
              if ((pPVar2->offset < pPVar1->size) ||
                 (pPVar2->offset - pPVar1->size < pPVar1->offset)) {
                local_90._0_4_ = 9;
                iVar28 = 7;
                bVar31 = false;
              }
              else {
                iVar28 = 0;
                bVar31 = true;
              }
              uVar27 = uVar27 + 1;
            } while (bVar31);
            if (iVar28 != 0) {
              if (iVar28 == 7) goto LAB_00147426;
              if (iVar28 != 8) goto LAB_00147446;
              break;
            }
            uVar16 = (ulong)((int)uVar16 + 1);
          } while (uVar16 < (face->toc).count - 1);
        }
        FVar13 = (face->toc).count;
        pPVar10 = (face->toc).tables;
        uVar16 = stream->size;
        if (FVar13 != 1) {
          uVar27 = 1;
          do {
            if ((uVar16 < pPVar10->size) || (uVar16 - pPVar10->size < pPVar10->offset))
            goto LAB_0014741e;
            pPVar10 = pPVar10 + 1;
            uVar25 = (ulong)uVar27;
            uVar27 = uVar27 + 1;
          } while (uVar25 < FVar13 - 1);
        }
        uVar25 = uVar16 - pPVar10->offset;
        if (uVar16 < pPVar10->offset) {
LAB_0014741e:
          local_90._0_4_ = 8;
LAB_00147426:
          ft_mem_free(local_68,(face->toc).tables);
          (face->toc).tables = (PCF_Table)0x0;
          local_94 = (uint)local_90;
        }
        else {
          local_94 = 0;
          if (uVar25 < pPVar10->size) {
            pPVar10->size = uVar25;
            local_94 = 0;
          }
        }
      }
    }
  }
LAB_00147446:
  if (local_94 != 0) goto LAB_0014744e;
  (face->root).num_faces = 1;
  (face->root).face_index = 0;
  if (face_index < 0) {
    return 0;
  }
  pFVar4 = (face->root).memory;
  local_98 = pcf_seek_to_table_type
                       (stream,(face->toc).tables,(face->toc).count,1,(FT_ULong *)&local_58,
                        &local_90);
  if ((local_98 == 0) &&
     (puVar11 = (ulong *)FT_Stream_ReadULongLE(stream,(FT_Error *)&local_98), local_58 = puVar11,
     ((ulong)puVar11 & 0xffffff00) == 0 && local_98 == 0)) {
    if (((ulong)puVar11 & 4) == 0) {
      pFVar12 = (FT_Memory)FT_Stream_ReadULongLE(stream,(FT_Error *)&local_98);
    }
    else {
      pFVar12 = (FT_Memory)FT_Stream_ReadULong(stream,(FT_Error *)&local_98);
    }
    if (local_98 != 0) goto LAB_0014753b;
    if ((FT_Memory)(CONCAT44(local_90._4_4_,(uint)local_90) / 9) < pFVar12) {
      local_98 = 8;
      goto LAB_0014753b;
    }
    local_70 = (FT_Memory)0x100;
    if (pFVar12 < (FT_Memory)0x100) {
      local_70 = pFVar12;
    }
    face->nprops = (int)local_70;
    buffer = (FT_Byte *)0x0;
    local_78 = (PCF_Property)CONCAT44(local_90._4_4_,(uint)local_90);
    pFVar14 = (FT_Memory)
              ft_mem_realloc(pFVar4,0x18,0,(FT_Long)local_70,(void *)0x0,(FT_Error *)&local_98);
    if (local_98 == 0) {
      local_60 = pFVar12;
      if (pFVar12 != (FT_Memory)0x0) {
        local_88 = (ulong *)((long)local_70 * 0x18);
        buffer = (FT_Byte *)0x0;
        puVar15 = (ulong *)0x0;
        uVar27 = local_98;
        local_80 = pFVar14;
        do {
          local_98 = uVar27;
          if (((ulong)puVar11 & 4) == 0) {
            fields = pcf_property_header;
          }
          else {
            fields = pcf_property_msb_header;
          }
          local_98 = FT_Stream_ReadFields(stream,fields,(void *)((long)local_80 + (long)puVar15));
          pFVar14 = local_80;
          if (local_98 != 0) goto LAB_0014753f;
          puVar15 = puVar15 + 3;
          local_98 = 0;
          uVar27 = 0;
        } while (local_88 != puVar15);
      }
      pFVar12 = local_60;
      local_98 = FT_Stream_Skip(stream,((long)local_60 - (long)local_70) * 9);
      if (local_98 == 0) {
        uVar27 = 0;
        if ((((ulong)pFVar12 & 3) != 0) &&
           (uVar27 = FT_Stream_Skip(stream,4 - ((ulong)pFVar12 & 3)), uVar27 != 0))
        goto LAB_001477a2;
        local_98 = uVar27;
        if (((ulong)puVar11 & 4) == 0) {
          puVar11 = (ulong *)FT_Stream_ReadULongLE(stream,(FT_Error *)&local_98);
        }
        else {
          puVar11 = (ulong *)FT_Stream_ReadULong(stream,(FT_Error *)&local_98);
        }
        if (local_98 == 0) {
          if (puVar11 <= (ulong *)((long)local_78 + (long)local_60 * -9)) {
            puVar15 = (ulong *)0x1000100;
            if (puVar11 < (ulong *)0x1000100) {
              puVar15 = puVar11;
            }
            buffer = (FT_Byte *)
                     ft_mem_realloc(pFVar4,1,0,(long)puVar15 + 1,(void *)0x0,(FT_Error *)&local_98);
            if (((local_98 == 0) &&
                (local_88 = puVar15, local_98 = FT_Stream_Read(stream,buffer,(FT_ULong)puVar15),
                local_98 == 0)) &&
               (local_78 = (PCF_Property)
                           ft_mem_realloc(pFVar4,0x18,0,(FT_Long)local_70,(void *)0x0,
                                          (FT_Error *)&local_98), local_98 == 0)) {
              face->properties = local_78;
              if (local_60 != (FT_Memory)0x0) {
                local_70 = (FT_Memory)((long)local_70 * 0x18);
                lVar29 = 0;
                do {
                  if (local_88 < *(ulong **)((long)pFVar14 + lVar29)) {
                    local_98 = 9;
                    uVar27 = 2;
                  }
                  else {
                    pvVar20 = ft_mem_strdup(pFVar4,(char *)((long)*(ulong **)
                                                                   ((long)pFVar14 + lVar29) +
                                                           (long)buffer),(FT_Error *)&local_98);
                    *(FT_Pointer *)(lVar29 + (long)&local_78->name) = pvVar20;
                    uVar27 = 2;
                    if (local_98 == 0) {
                      FVar3 = *(FT_Byte *)((long)pFVar14 + lVar29 + 8);
                      (&local_78->isString)[lVar29] = FVar3;
                      puVar11 = *(ulong **)((long)pFVar14 + lVar29 + 0x10);
                      if (FVar3 == '\0') {
                        *(ulong **)((long)&local_78->value + lVar29) = puVar11;
                      }
                      else {
                        if (local_88 < puVar11) {
                          local_98 = 9;
                          uVar27 = 2;
                          bVar32 = false;
                        }
                        else {
                          pvVar20 = ft_mem_strdup(pFVar4,(char *)((long)puVar11 + (long)buffer),
                                                  (FT_Error *)&local_98);
                          *(FT_Pointer *)((long)&local_78->value + lVar29) = pvVar20;
                          bVar32 = local_98 == 0;
                          uVar27 = (uint)!bVar32 * 2;
                        }
                        if (!bVar32) goto LAB_00147dc0;
                      }
                      uVar27 = 0;
                    }
                  }
LAB_00147dc0:
                  if (uVar27 != 0) {
                    if (uVar27 == 2) goto LAB_0014753f;
                    goto LAB_00147555;
                  }
                  lVar29 = lVar29 + 0x18;
                } while (local_70 != (FT_Memory)lVar29);
              }
              local_98 = 0;
            }
            goto LAB_0014753f;
          }
          local_98 = 8;
        }
      }
      else {
LAB_001477a2:
        local_98 = 0x53;
      }
      buffer = (FT_Byte *)0x0;
    }
  }
  else {
LAB_0014753b:
    buffer = (FT_Byte *)0x0;
    pFVar14 = (FT_Memory)(void *)0x0;
  }
LAB_0014753f:
  ft_mem_free(pFVar4,pFVar14);
  ft_mem_free(pFVar4,buffer);
  uVar27 = local_98;
LAB_00147555:
  local_94 = uVar27;
  if (uVar27 == 0) {
    FVar13 = (face->toc).count;
    if (FVar13 == 0) {
      bVar32 = true;
    }
    else {
      pPVar10 = (face->toc).tables;
      do {
        FVar13 = FVar13 - 1;
        bVar31 = pPVar10->type == 0x100;
        bVar32 = !bVar31;
        if (bVar31) break;
        pPVar10 = pPVar10 + 1;
      } while (FVar13 != 0);
    }
    local_94 = 0;
    if ((!bVar32) || (local_94 = uVar27, local_94 = pcf_get_accel(stream,face,2), local_94 == 0)) {
      local_80 = (face->root).memory;
      local_98 = pcf_seek_to_table_type
                           (stream,(face->toc).tables,(face->toc).count,4,(FT_ULong *)&local_58,
                            &local_90);
      uVar27 = local_98;
      if ((local_98 == 0) &&
         ((local_58 = (ulong *)FT_Stream_ReadULongLE(stream,(FT_Error *)&local_98),
          uVar27 = local_98, local_98 == 0 && (uVar27 = 3, ((ulong)local_58 & 0xfffffe00) == 0)))) {
        uVar16 = (ulong)local_58 & 0xffffff00;
        local_88 = local_58;
        if (((ulong)local_58 & 0xffffff00) == 0) {
          if (((ulong)local_58 & 4) == 0) {
            FVar13 = FT_Stream_ReadULongLE(stream,(FT_Error *)&local_98);
          }
          else {
            FVar13 = FT_Stream_ReadULong(stream,(FT_Error *)&local_98);
          }
        }
        else {
          if (((ulong)local_58 & 4) == 0) {
            uVar7 = FT_Stream_ReadUShortLE(stream,(FT_Error *)&local_98);
          }
          else {
            uVar7 = FT_Stream_ReadUShort(stream,(FT_Error *)&local_98);
          }
          FVar13 = (FT_ULong)uVar7;
        }
        if (local_98 == 0) {
          if (uVar16 == 0) {
            uVar16 = CONCAT44(local_90._4_4_,(uint)local_90) / 0xc;
          }
          else {
            uVar16 = CONCAT44(local_90._4_4_,(uint)local_90) / 5;
          }
          uVar27 = 8;
          if (FVar13 - 1 < uVar16) {
            FVar30 = 0x10000;
            if (FVar13 < 0x10000) {
              FVar30 = FVar13;
            }
            face->nmetrics = FVar30;
            metric = (PCF_Metric)
                     ft_mem_realloc(local_80,0x18,0,FVar30,(void *)0x0,(FT_Error *)&local_98);
            face->metrics = metric;
            uVar27 = local_98;
            if (local_98 == 0) {
              while (FVar13 != 0) {
                local_98 = 0;
                local_98 = pcf_get_metric(stream,(FT_ULong)local_88,metric);
                metric->bits = 0;
                if (local_98 != 0) break;
                if ((metric->rightSideBearing < metric->leftSideBearing) ||
                   (SBORROW4((int)metric->ascent,-(int)metric->descent) !=
                    (int)metric->ascent + (int)metric->descent < 0)) {
                  metric->descent = 0;
                  metric->leftSideBearing = 0;
                  metric->rightSideBearing = 0;
                  metric->characterWidth = 0;
                  metric->ascent = 0;
                }
                metric = metric + 1;
                FVar30 = FVar30 - 1;
                FVar13 = FVar30;
              }
              uVar27 = local_98;
              if (local_98 != 0) {
                ft_mem_free(local_80,face->metrics);
                face->metrics = (PCF_Metric)0x0;
                uVar27 = local_98;
              }
            }
          }
        }
      }
      local_94 = uVar27;
      if (uVar27 == 0) {
        pFVar4 = (face->root).memory;
        local_98 = pcf_seek_to_table_type
                             (stream,(face->toc).tables,(face->toc).count,8,(FT_ULong *)&local_58,
                              &local_90);
        uVar27 = local_98;
        if ((local_98 == 0) &&
           (local_98 = FT_Stream_EnterFrame(stream,8), uVar27 = local_98, local_98 == 0)) {
          puVar11 = (ulong *)FT_Stream_GetULongLE(stream);
          local_58 = puVar11;
          if (((ulong)puVar11 & 4) == 0) {
            pFVar12 = (FT_Memory)FT_Stream_GetULongLE(stream);
          }
          else {
            pFVar12 = (FT_Memory)FT_Stream_GetULong(stream);
          }
          FT_Stream_ExitFrame(stream);
          uVar27 = 3;
          if (((ulong)puVar11 & 0xffffff00) == 0) {
            pFVar14 = (FT_Memory)0x10000;
            if (pFVar12 < (FT_Memory)0x10000) {
              pFVar14 = pFVar12;
            }
            if ((pFVar14 == (FT_Memory)face->nmetrics) &&
               (local_80 = pFVar14,
               puVar15 = (ulong *)ft_mem_realloc(pFVar4,8,0,(FT_Long)pFVar14,(void *)0x0,
                                                 (FT_Error *)&local_98), uVar27 = local_98,
               local_98 == 0)) {
              local_88 = puVar15;
              local_70 = pFVar12;
              if (pFVar12 != (FT_Memory)0x0) {
                pFVar12 = (FT_Memory)0x0;
                do {
                  if (((ulong)puVar11 & 4) == 0) {
                    uVar16 = FT_Stream_ReadULongLE(stream,(FT_Error *)&local_98);
                  }
                  else {
                    uVar16 = FT_Stream_ReadULong(stream,(FT_Error *)&local_98);
                  }
                  local_88[(long)pFVar12] = uVar16;
                  pFVar12 = (FT_Memory)((long)&pFVar12->user + 1);
                } while (local_80 != pFVar12);
              }
              if (local_98 == 0) {
                lVar29 = 4;
                do {
                  if (((ulong)puVar11 & 4) == 0) {
                    FT_Stream_ReadULongLE(stream,(FT_Error *)&local_98);
                  }
                  else {
                    FT_Stream_ReadULong(stream,(FT_Error *)&local_98);
                  }
                  if (local_98 != 0) goto LAB_001478f0;
                  lVar29 = lVar29 + -1;
                } while (lVar29 != 0);
                if (local_70 != (FT_Memory)0x0) {
                  lVar29 = 0;
                  puVar15 = local_88;
                  do {
                    uVar16 = *puVar15;
                    if ((-1 < (long)uVar16) && (uVar16 <= CONCAT44(local_90._4_4_,(uint)local_90)))
                    {
                      (&face->metrics->bits)[lVar29] = uVar16 + stream->pos;
                    }
                    lVar29 = lVar29 + 3;
                    puVar15 = puVar15 + 1;
                  } while ((long)local_80 * 3 != lVar29);
                }
                face->bitmapsFormat = (FT_ULong)puVar11;
              }
LAB_001478f0:
              ft_mem_free(pFVar4,local_88);
              uVar27 = local_98;
            }
          }
        }
        local_94 = uVar27;
        if (((uVar27 == 0) && (local_94 = pcf_get_encodings(stream,face), local_94 == 0)) &&
           ((uVar27 = 0, bVar32 ||
            (local_94 = pcf_get_accel(stream,face,0x100), uVar27 = local_94, local_94 == 0)))) {
          local_94 = uVar27;
          uVar16 = (face->root).face_flags;
          (face->root).face_flags = uVar16 | 0x92;
          if ((face->accel).constantWidth != '\0') {
            (face->root).face_flags = uVar16 | 0x96;
          }
          local_94 = pcf_interpret_style(face);
          if (local_94 == 0) {
            pPVar17 = pcf_find_property(face,"FAMILY_NAME");
            if ((pPVar17 == (PCF_Property)0x0) || (pPVar17->isString == '\0')) {
              (face->root).family_name = (FT_String *)0x0;
            }
            else {
              pFVar18 = (FT_String *)
                        ft_mem_strdup(local_68,(pPVar17->value).atom,(FT_Error *)&local_94);
              (face->root).family_name = pFVar18;
              if (local_94 != 0) goto LAB_0014744e;
            }
            (face->root).num_glyphs = face->nmetrics + 1;
            (face->root).num_fixed_sizes = 1;
            pFVar19 = (FT_Bitmap_Size *)
                      ft_mem_realloc(local_68,0x20,0,1,(void *)0x0,(FT_Error *)&local_94);
            (face->root).available_sizes = pFVar19;
            if (local_94 == 0) {
              pFVar19->x_ppem = 0;
              pFVar19->y_ppem = 0;
              pFVar19->height = 0;
              pFVar19->width = 0;
              *(undefined4 *)&pFVar19->field_0x4 = 0;
              pFVar19->size = 0;
              uVar25 = (face->accel).fontDescent + (face->accel).fontAscent;
              uVar16 = -uVar25;
              if (0 < (long)uVar25) {
                uVar16 = uVar25;
              }
              sVar8 = 0x7fff;
              if (uVar16 < 0x8000) {
                sVar26 = (short)uVar25;
                sVar8 = -sVar26;
                if (0 < sVar26) {
                  sVar8 = sVar26;
                }
              }
              pFVar19->height = sVar8;
              pPVar17 = pcf_find_property(face,"AVERAGE_WIDTH");
              if (pPVar17 == (PCF_Property)0x0) {
                FVar21 = FT_MulDiv((long)sVar8,2,3);
                sVar8 = (short)FVar21;
              }
              else {
                FVar13 = (pPVar17->value).ul;
                uVar16 = -FVar13;
                if (0 < (long)FVar13) {
                  uVar16 = FVar13;
                }
                sVar8 = 0x7fff;
                if (uVar16 < 0x4fff2) {
                  auVar5 = SEXT816((long)(FVar13 + 5)) * SEXT816(0x6666666666666667);
                  sVar26 = (short)(auVar5._8_4_ >> 2) - (auVar5._14_2_ >> 0xf);
                  sVar8 = -sVar26;
                  if (0 < sVar26) {
                    sVar8 = sVar26;
                  }
                }
              }
              pFVar19->width = sVar8;
              pPVar17 = pcf_find_property(face,"POINT_SIZE");
              if (pPVar17 != (PCF_Property)0x0) {
                uVar16 = (pPVar17->value).l;
                uVar25 = -uVar16;
                if (0 < (long)uVar16) {
                  uVar25 = uVar16;
                }
                FVar21 = 0x7fff;
                if (uVar25 < 0x504c3) {
                  FVar21 = FT_MulDiv(uVar25,0x70800,0x11a4e);
                }
                pFVar19->size = FVar21;
              }
              pPVar17 = pcf_find_property(face,"PIXEL_SIZE");
              if (pPVar17 != (PCF_Property)0x0) {
                FVar13 = (pPVar17->value).ul;
                uVar16 = -FVar13;
                if (0 < (long)FVar13) {
                  uVar16 = FVar13;
                }
                uVar25 = 0x1fffc0;
                if (uVar16 < 0x8000) {
                  iVar24 = (int)(short)FVar13;
                  iVar28 = -iVar24;
                  if (0 < iVar24) {
                    iVar28 = iVar24;
                  }
                  uVar25 = (ulong)(uint)(iVar28 << 6);
                }
                pFVar19->y_ppem = uVar25;
              }
              pPVar17 = pcf_find_property(face,"RESOLUTION_X");
              if (pPVar17 == (PCF_Property)0x0) {
                sVar8 = 0;
              }
              else {
                uVar16 = (pPVar17->value).l;
                uVar25 = -uVar16;
                if (0 < (long)uVar16) {
                  uVar25 = uVar16;
                }
                sVar8 = 0x7fff;
                if (uVar25 < 0x8000) {
                  sVar26 = (short)uVar16;
                  sVar8 = -sVar26;
                  if (0 < sVar26) {
                    sVar8 = sVar26;
                  }
                }
              }
              pPVar17 = pcf_find_property(face,"RESOLUTION_Y");
              if (pPVar17 == (PCF_Property)0x0) {
                sVar26 = 0;
              }
              else {
                uVar16 = (pPVar17->value).l;
                uVar25 = -uVar16;
                if (0 < (long)uVar16) {
                  uVar25 = uVar16;
                }
                sVar26 = 0x7fff;
                if (uVar25 < 0x8000) {
                  sVar9 = (short)uVar16;
                  sVar26 = -sVar9;
                  if (0 < sVar9) {
                    sVar26 = sVar9;
                  }
                }
              }
              if (pFVar19->y_ppem == 0) {
                pFVar19->y_ppem = pFVar19->size;
                if (sVar26 != 0) {
                  FVar21 = FT_MulDiv(pFVar19->size,(long)sVar26,0x48);
                  pFVar19->y_ppem = FVar21;
                }
              }
              FVar21 = pFVar19->y_ppem;
              if ((sVar8 != 0) && (sVar26 != 0)) {
                FVar21 = FT_MulDiv(FVar21,(long)sVar8,(long)sVar26);
              }
              pFVar19->x_ppem = FVar21;
              pPVar17 = pcf_find_property(face,"CHARSET_REGISTRY");
              pPVar22 = pcf_find_property(face,"CHARSET_ENCODING");
              if (((pPVar17 != (PCF_Property)0x0) &&
                  (pPVar22 != (PCF_Property)0x0 && pPVar17->isString != '\0')) &&
                 (pPVar22->isString != '\0')) {
                pcVar23 = (char *)ft_mem_strdup(local_68,(pPVar22->value).atom,(FT_Error *)&local_94
                                               );
                face->charset_encoding = pcVar23;
                if (local_94 == 0) {
                  pcVar23 = (char *)ft_mem_strdup(local_68,(pPVar17->value).atom,
                                                  (FT_Error *)&local_94);
                  face->charset_registry = pcVar23;
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0014744e:
  if (local_94 != 0) {
    local_94 = 3;
  }
  return local_94;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  pcf_load_font( FT_Stream  stream,
                 PCF_Face   face,
                 FT_Long    face_index )
  {
    FT_Face    root   = FT_FACE( face );
    FT_Error   error;
    FT_Memory  memory = FT_FACE( face )->memory;
    FT_Bool    hasBDFAccelerators;


    error = pcf_read_TOC( stream, face );
    if ( error )
      goto Exit;

    root->num_faces  = 1;
    root->face_index = 0;

    /* If we are performing a simple font format check, exit immediately. */
    if ( face_index < 0 )
      return FT_Err_Ok;

    error = pcf_get_properties( stream, face );
    if ( error )
      goto Exit;

    /* Use the old accelerators if no BDF accelerators are in the file. */
    hasBDFAccelerators = pcf_has_table_type( face->toc.tables,
                                             face->toc.count,
                                             PCF_BDF_ACCELERATORS );
    if ( !hasBDFAccelerators )
    {
      error = pcf_get_accel( stream, face, PCF_ACCELERATORS );
      if ( error )
        goto Exit;
    }

    /* metrics */
    error = pcf_get_metrics( stream, face );
    if ( error )
      goto Exit;

    /* bitmaps */
    error = pcf_get_bitmaps( stream, face );
    if ( error )
      goto Exit;

    /* encodings */
    error = pcf_get_encodings( stream, face );
    if ( error )
      goto Exit;

    /* BDF style accelerators (i.e. bounds based on encoded glyphs) */
    if ( hasBDFAccelerators )
    {
      error = pcf_get_accel( stream, face, PCF_BDF_ACCELERATORS );
      if ( error )
        goto Exit;
    }

    /* XXX: TO DO: inkmetrics and glyph_names are missing */

    /* now construct the face object */
    {
      PCF_Property  prop;


      root->face_flags |= FT_FACE_FLAG_FIXED_SIZES |
                          FT_FACE_FLAG_HORIZONTAL  |
                          FT_FACE_FLAG_FAST_GLYPHS;

      if ( face->accel.constantWidth )
        root->face_flags |= FT_FACE_FLAG_FIXED_WIDTH;

      if ( FT_SET_ERROR( pcf_interpret_style( face ) ) )
        goto Exit;

      prop = pcf_find_property( face, "FAMILY_NAME" );
      if ( prop && prop->isString )
      {

#ifdef PCF_CONFIG_OPTION_LONG_FAMILY_NAMES

        PCF_Driver  driver = (PCF_Driver)FT_FACE_DRIVER( face );


        if ( !driver->no_long_family_names )
        {
          /* Prepend the foundry name plus a space to the family name.     */
          /* There are many fonts just called `Fixed' which look           */
          /* completely different, and which have nothing to do with each  */
          /* other.  When selecting `Fixed' in KDE or Gnome one gets       */
          /* results that appear rather random, the style changes often if */
          /* one changes the size and one cannot select some fonts at all. */
          /*                                                               */
          /* We also check whether we have `wide' characters; all put      */
          /* together, we get family names like `Sony Fixed' or `Misc      */
          /* Fixed Wide'.                                                  */

          PCF_Property  foundry_prop, point_size_prop, average_width_prop;

          int  l    = ft_strlen( prop->value.atom ) + 1;
          int  wide = 0;


          foundry_prop       = pcf_find_property( face, "FOUNDRY" );
          point_size_prop    = pcf_find_property( face, "POINT_SIZE" );
          average_width_prop = pcf_find_property( face, "AVERAGE_WIDTH" );

          if ( point_size_prop && average_width_prop )
          {
            if ( average_width_prop->value.l >= point_size_prop->value.l )
            {
              /* This font is at least square shaped or even wider */
              wide = 1;
              l   += ft_strlen( " Wide" );
            }
          }

          if ( foundry_prop && foundry_prop->isString )
          {
            l += ft_strlen( foundry_prop->value.atom ) + 1;

            if ( FT_NEW_ARRAY( root->family_name, l ) )
              goto Exit;

            ft_strcpy( root->family_name, foundry_prop->value.atom );
            ft_strcat( root->family_name, " " );
            ft_strcat( root->family_name, prop->value.atom );
          }
          else
          {
            if ( FT_NEW_ARRAY( root->family_name, l ) )
              goto Exit;

            ft_strcpy( root->family_name, prop->value.atom );
          }

          if ( wide )
            ft_strcat( root->family_name, " Wide" );
        }
        else

#endif /* PCF_CONFIG_OPTION_LONG_FAMILY_NAMES */

        {
          if ( FT_STRDUP( root->family_name, prop->value.atom ) )
            goto Exit;
        }
      }
      else
        root->family_name = NULL;

      /*
       * Note: We shift all glyph indices by +1 since we must
       * respect the convention that glyph 0 always corresponds
       * to the `missing glyph'.
       *
       * This implies bumping the number of `available' glyphs by 1.
       */
      root->num_glyphs = (FT_Long)( face->nmetrics + 1 );

      root->num_fixed_sizes = 1;
      if ( FT_NEW_ARRAY( root->available_sizes, 1 ) )
        goto Exit;

      {
        FT_Bitmap_Size*  bsize = root->available_sizes;
        FT_Short         resolution_x = 0, resolution_y = 0;


        FT_ZERO( bsize );

        /* for simplicity, we take absolute values of integer properties */

#if 0
        bsize->height = face->accel.maxbounds.ascent << 6;
#endif

#ifdef FT_DEBUG_LEVEL_TRACE
        if ( face->accel.fontAscent + face->accel.fontDescent < 0 )
          FT_TRACE0(( "pcf_load_font: negative height\n" ));
#endif
        if ( FT_ABS( face->accel.fontAscent +
                     face->accel.fontDescent ) > 0x7FFF )
        {
          bsize->height = 0x7FFF;
          FT_TRACE0(( "pcf_load_font: clamping height to value %d\n",
                      bsize->height ));
        }
        else
          bsize->height = FT_ABS( (FT_Short)( face->accel.fontAscent +
                                              face->accel.fontDescent ) );

        prop = pcf_find_property( face, "AVERAGE_WIDTH" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "pcf_load_font: negative average width\n" ));
#endif
          if ( ( FT_ABS( prop->value.l ) > 0x7FFFL * 10 - 5 ) )
          {
            bsize->width = 0x7FFF;
            FT_TRACE0(( "pcf_load_font: clamping average width to value %d\n",
                        bsize->width ));
          }
          else
            bsize->width = FT_ABS( (FT_Short)( ( prop->value.l + 5 ) / 10 ) );
        }
        else
        {
          /* this is a heuristical value */
          bsize->width = (FT_Short)FT_MulDiv( bsize->height, 2, 3 );
        }

        prop = pcf_find_property( face, "POINT_SIZE" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "pcf_load_font: negative point size\n" ));
#endif
          /* convert from 722.7 decipoints to 72 points per inch */
          if ( FT_ABS( prop->value.l ) > 0x504C2L ) /* 0x7FFF * 72270/7200 */
          {
            bsize->size = 0x7FFF;
            FT_TRACE0(( "pcf_load_font: clamping point size to value %d\n",
                        bsize->size ));
          }
          else
            bsize->size = FT_MulDiv( FT_ABS( prop->value.l ),
                                     64 * 7200,
                                     72270L );
        }

        prop = pcf_find_property( face, "PIXEL_SIZE" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "pcf_load_font: negative pixel size\n" ));
#endif
          if ( FT_ABS( prop->value.l ) > 0x7FFF )
          {
            bsize->y_ppem = 0x7FFF << 6;
            FT_TRACE0(( "pcf_load_font: clamping pixel size to value %d\n",
                        bsize->y_ppem ));
          }
          else
            bsize->y_ppem = FT_ABS( (FT_Short)prop->value.l ) << 6;
        }

        prop = pcf_find_property( face, "RESOLUTION_X" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "pcf_load_font: negative X resolution\n" ));
#endif
          if ( FT_ABS( prop->value.l ) > 0x7FFF )
          {
            resolution_x = 0x7FFF;
            FT_TRACE0(( "pcf_load_font: clamping X resolution to value %d\n",
                        resolution_x ));
          }
          else
            resolution_x = FT_ABS( (FT_Short)prop->value.l );
        }

        prop = pcf_find_property( face, "RESOLUTION_Y" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "pcf_load_font: negative Y resolution\n" ));
#endif
          if ( FT_ABS( prop->value.l ) > 0x7FFF )
          {
            resolution_y = 0x7FFF;
            FT_TRACE0(( "pcf_load_font: clamping Y resolution to value %d\n",
                        resolution_y ));
          }
          else
            resolution_y = FT_ABS( (FT_Short)prop->value.l );
        }

        if ( bsize->y_ppem == 0 )
        {
          bsize->y_ppem = bsize->size;
          if ( resolution_y )
            bsize->y_ppem = FT_MulDiv( bsize->y_ppem, resolution_y, 72 );
        }
        if ( resolution_x && resolution_y )
          bsize->x_ppem = FT_MulDiv( bsize->y_ppem,
                                     resolution_x,
                                     resolution_y );
        else
          bsize->x_ppem = bsize->y_ppem;
      }

      /* set up charset */
      {
        PCF_Property  charset_registry, charset_encoding;


        charset_registry = pcf_find_property( face, "CHARSET_REGISTRY" );
        charset_encoding = pcf_find_property( face, "CHARSET_ENCODING" );

        if ( charset_registry && charset_registry->isString &&
             charset_encoding && charset_encoding->isString )
        {
          if ( FT_STRDUP( face->charset_encoding,
                          charset_encoding->value.atom ) ||
               FT_STRDUP( face->charset_registry,
                          charset_registry->value.atom ) )
            goto Exit;
        }
      }
    }

  Exit:
    if ( error )
    {
      /* This is done to respect the behaviour of the original */
      /* PCF font driver.                                      */
      error = FT_THROW( Invalid_File_Format );
    }

    return error;
  }